

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  short sVar1;
  ZSTD_paramSwitch_e ZVar2;
  ZSTD_entropyCTables_t *pZVar3;
  uint uVar4;
  U32 UVar5;
  undefined8 in_RAX;
  uint uVar6;
  uint *puVar7;
  long lVar8;
  uint *puVar9;
  long lVar10;
  byte bVar11;
  uint lit;
  undefined8 uStack_28;
  
  bVar11 = 0;
  ZVar2 = optPtr->literalCompressionMode;
  optPtr->priceType = zop_dynamic;
  uStack_28 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 9) {
      optPtr->priceType = zop_predef;
    }
    if (optPtr->symbolCosts == (ZSTD_entropyCTables_t *)0x0) {
      __assert_fail("optPtr->symbolCosts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x9a,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if ((optPtr->symbolCosts->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      if (ZVar2 != ZSTD_ps_disable) {
        if (optPtr->litFreq == (uint *)0x0) {
          __assert_fail("optPtr->litFreq != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0xa3,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        optPtr->litSum = 0;
        lVar10 = 0;
        do {
          UVar5 = HUF_getNbBitsFromCTable((HUF_CElt *)optPtr->symbolCosts,(U32)lVar10);
          if (0xb < UVar5) {
            __assert_fail("bitCost <= scaleLog",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0xa8,
                          "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                         );
          }
          uVar6 = 1 << (0xbU - (char)UVar5 & 0x1f);
          if (UVar5 == 0) {
            uVar6 = 1;
          }
          optPtr->litFreq[lVar10] = uVar6;
          optPtr->litSum = optPtr->litSum + uVar6;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x100);
      }
      pZVar3 = optPtr->symbolCosts;
      sVar1 = (short)(pZVar3->fse).litlengthCTable[0];
      lVar10 = 1;
      if (sVar1 != 0) {
        lVar10 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->litLengthSum = 0;
      lVar8 = 0;
      do {
        uVar6 = (pZVar3->fse).litlengthCTable[lVar10 + lVar8 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar6) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0xb4,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar4 = 1 << (10U - (char)(uVar6 >> 0x10) & 0x1f);
        if (uVar6 < 0x10000) {
          uVar4 = 1;
        }
        optPtr->litLengthFreq[lVar8] = uVar4;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar4;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x24);
      sVar1 = (short)(pZVar3->fse).matchlengthCTable[0];
      lVar10 = 1;
      if (sVar1 != 0) {
        lVar10 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->matchLengthSum = 0;
      lVar8 = 0;
      do {
        uVar6 = (pZVar3->fse).matchlengthCTable[lVar10 + lVar8 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar6) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0xc0,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar4 = 1 << (10U - (char)(uVar6 >> 0x10) & 0x1f);
        if (uVar6 < 0x10000) {
          uVar4 = 1;
        }
        optPtr->matchLengthFreq[lVar8] = uVar4;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar4;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x35);
      sVar1 = (short)(pZVar3->fse).offcodeCTable[0];
      lVar10 = 1;
      if (sVar1 != 0) {
        lVar10 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->offCodeSum = 0;
      lVar8 = 0;
      do {
        uVar6 = (pZVar3->fse).offcodeCTable[lVar10 + lVar8 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar6) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0xcc,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar4 = 1 << (10U - (char)(uVar6 >> 0x10) & 0x1f);
        if (uVar6 < 0x10000) {
          uVar4 = 1;
        }
        optPtr->offCodeFreq[lVar8] = uVar4;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar4;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x20);
      goto LAB_0020e5b8;
    }
    if (optPtr->litFreq == (uint *)0x0) {
      __assert_fail("optPtr->litFreq != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0xd3,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if (ZVar2 != ZSTD_ps_disable) {
      uStack_28 = CONCAT44(0xff,(int)in_RAX);
      HIST_count_simple(optPtr->litFreq,(uint *)((long)&uStack_28 + 4),src,srcSize);
      puVar7 = optPtr->litFreq;
      lVar10 = 0;
      UVar5 = 0;
      do {
        uVar6 = puVar7[lVar10];
        uVar6 = ((uVar6 >> 8) + 1) - (uint)(uVar6 == 0);
        UVar5 = UVar5 + uVar6;
        puVar7[lVar10] = uVar6;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x100);
      optPtr->litSum = UVar5;
    }
    memcpy(optPtr->litLengthFreq,&DAT_00272be0,0x90);
    optPtr->litLengthSum = 0x28;
    puVar7 = optPtr->matchLengthFreq;
    lVar10 = 0;
    do {
      puVar7[lVar10] = 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x35);
    optPtr->matchLengthSum = 0x35;
    puVar7 = &DAT_00272c70;
    puVar9 = optPtr->offCodeFreq;
    for (lVar10 = 0x20; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar9 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
      puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    }
    UVar5 = 0x35;
  }
  else {
    if (ZVar2 != ZSTD_ps_disable) {
      UVar5 = ZSTD_scaleStats(optPtr->litFreq,0xff,0xc);
      optPtr->litSum = UVar5;
    }
    UVar5 = ZSTD_scaleStats(optPtr->litLengthFreq,0x23,0xb);
    optPtr->litLengthSum = UVar5;
    UVar5 = ZSTD_scaleStats(optPtr->matchLengthFreq,0x34,0xb);
    optPtr->matchLengthSum = UVar5;
    UVar5 = ZSTD_scaleStats(optPtr->offCodeFreq,0x1f,0xb);
  }
  optPtr->offCodeSum = UVar5;
LAB_0020e5b8:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* no literals stats collected -> first block assumed -> init */

        /* heuristic: use pre-defined stats for too small inputs */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {
            DEBUGLOG(5, "srcSize <= %i : use predefined stats", ZSTD_PREDEF_THRESHOLD);
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {

            /* huffman stats covering the full value set : table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                /* generate literals statistics from huffman table */
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBitsFromCTable(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* first block, no dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                /* base initial cost of literals on direct frequency within src */
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStats(optPtr->litFreq, MaxLit, 8, base_0possible);
            }

            {   unsigned const baseLLfreqs[MaxLL+1] = {
                    4, 2, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->litLengthFreq, baseLLfreqs, sizeof(baseLLfreqs));
                optPtr->litLengthSum = sum_u32(baseLLfreqs, MaxLL+1);
            }

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned const baseOFCfreqs[MaxOff+1] = {
                    6, 2, 1, 1, 2, 3, 4, 4,
                    4, 3, 2, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->offCodeFreq, baseOFCfreqs, sizeof(baseOFCfreqs));
                optPtr->offCodeSum = sum_u32(baseOFCfreqs, MaxOff+1);
            }

        }

    } else {   /* new block : scale down accumulated statistics */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_scaleStats(optPtr->litFreq, MaxLit, 12);
        optPtr->litLengthSum = ZSTD_scaleStats(optPtr->litLengthFreq, MaxLL, 11);
        optPtr->matchLengthSum = ZSTD_scaleStats(optPtr->matchLengthFreq, MaxML, 11);
        optPtr->offCodeSum = ZSTD_scaleStats(optPtr->offCodeFreq, MaxOff, 11);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}